

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

string * __thiscall
XipFile::XipEntry::name_abi_cxx11_(string *__return_storage_ptr__,XipEntry *this,XipFile *xip)

{
  ReadWriter_ptr r;
  shared_ptr<ReadWriter> local_30;
  FileContainer local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if (this->_rvaname == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    getrvareader((XipFile *)&stack0xffffffffffffffe0,(uint32_t)xip,this->_rvaname);
    local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_20._vptr_FileContainer;
    local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_18
    ;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_18->_M_use_count = local_18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_18->_M_use_count = local_18->_M_use_count + 1;
      }
    }
    readstr<std::shared_ptr<ReadWriter>>(__return_storage_ptr__,&local_30);
    if (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string name(XipFile& xip)
        {
            if (_rvaname==0)
                return "";
            ReadWriter_ptr r= xip.getrvareader(_rvaname, 260);
            return readstr(r);
        }